

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param_parse.cpp
# Opt level: O1

param * param_parse::parse(int argc,char **argv)

{
  int iVar1;
  run_param *prVar2;
  ostream *poVar3;
  long *local_48 [2];
  long local_38 [2];
  
  if (argc != 1) {
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"run","");
    iVar1 = std::__cxx11::string::compare((char *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    if (iVar1 == 0) {
      prVar2 = run_param_parse::parse(argc,argv);
      return &prVar2->super_param;
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,"unsupport command: \'");
    poVar3 = std::operator<<(poVar3,argv[1]);
    poVar3 = std::operator<<(poVar3,"\'");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"please use: ");
  poVar3 = std::operator<<(poVar3,*argv);
  poVar3 = std::operator<<(poVar3," run --help");
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(-1);
}

Assistant:

param *param_parse::parse(int argc, char *argv[]) {
  if (argc == 1) {
    std::cerr << "please use: " << argv[0] << " run --help" << std::endl;
    exit(-1);
  }

  if (argv[1] == string("run")) {
    return run_param_parse::parse(argc, argv);
  } else {
    std::cerr << "unsupport command: '" << argv[1] << "'" << std::endl;
    std::cerr << "please use: " << argv[0] << " run --help" << std::endl;
    exit(-1);
  }
}